

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HillClimbing.cpp
# Opt level: O1

Solution * HillClimbing::runHillClimbing(Solution *solution)

{
  pointer ppNVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  SolutionNeighbourhood *this;
  Solution *solution_00;
  
  this = (SolutionNeighbourhood *)operator_new(0x40);
  SolutionNeighbourhood::SolutionNeighbourhood(this,solution);
  uVar3 = Validator::evaluateSolution(solution);
  while( true ) {
    solution_00 = SolutionNeighbourhood::getNext(this);
    if (solution_00 == (Solution *)0x0) break;
    bVar2 = SolutionNeighbourhood::hasEnded(this);
    if (bVar2) break;
    uVar4 = Validator::evaluateSolution(solution_00);
    if ((int)uVar4 < (int)uVar3) {
      ppNVar1 = (this->nurseVector).
                super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppNVar1 != (pointer)0x0) {
        operator_delete(ppNVar1,(long)(this->nurseVector).
                                      super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppNVar1);
      }
      operator_delete(this,0x40);
      this = (SolutionNeighbourhood *)operator_new(0x40);
      SolutionNeighbourhood::SolutionNeighbourhood(this,solution_00);
      uVar3 = uVar4;
    }
  }
  ppNVar1 = (this->nurseVector).
            super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)(this->nurseVector).
                                  super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar1
                   );
  }
  operator_delete(this,0x40);
  return solution_00;
}

Assistant:

Solution* HillClimbing::runHillClimbing(Solution* solution){

    SolutionNeighbourhood* neighbourhood = new SolutionNeighbourhood(solution);

    int bestScore = Validator::evaluateSolution(*solution);

    //next will undo last move so it can reset the initial solution
    while((solution = neighbourhood->getNext()) && !neighbourhood->hasEnded())
    {
        int currentScore = Validator::evaluateSolution(*solution);
        if(bestScore > currentScore)
        {
            delete neighbourhood;
            neighbourhood = new SolutionNeighbourhood(solution);
            bestScore = currentScore;
        }
    }
    delete neighbourhood;
    return solution;
}